

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O0

string * cmStrCat<char_const(&)[21],cm::static_string_view&,char_const(&)[12],std::__cxx11::string_const&,char_const(&)[4],std::__cxx11::string_const&,char>
                   (string *__return_storage_ptr__,char (*a) [21],static_string_view *b,
                   char (*args) [12],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
                   char (*args_2) [4],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_3,
                   char *args_4)

{
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  cmAlphaNum local_288;
  cmAlphaNum local_250;
  cmAlphaNum local_218;
  cmAlphaNum local_1e0;
  cmAlphaNum local_1a8;
  undefined8 local_170;
  undefined8 local_168;
  cmAlphaNum local_160;
  cmAlphaNum local_128;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_f0;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_d8;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_c0;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_a8;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_90;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_78;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_60;
  iterator local_48;
  undefined8 local_40;
  char (*local_38) [4];
  char (*args_local_2) [4];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local_1;
  char (*args_local) [12];
  static_string_view *b_local;
  char (*a_local) [21];
  
  local_38 = args_2;
  args_local_2 = (char (*) [4])args_1;
  args_local_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args;
  args_local = (char (*) [12])b;
  b_local = (static_string_view *)a;
  a_local = (char (*) [21])__return_storage_ptr__;
  cmAlphaNum::cmAlphaNum(&local_128,*a);
  cmStrCat<char_const(&)[21],cm::static_string_view&,char_const(&)[12],std::__cxx11::string_const&,char_const(&)[4],std::__cxx11::string_const&,char>(char_const(&)[21],cm::static_string_view&,char_const(&)[12],std::__cxx11::string_const&,char_const(&)[4],std::__cxx11::string_const&,char&&)
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&local_f0,
             &cmStrCat<char_const(&)[21],cm::static_string_view&,char_const(&)[12],std::__cxx11::string_const&,char_const(&)[4],std::__cxx11::string_const&,char>(char_const&[],cm::static_string_view&,char_const&[],std::__cxx11::string_const&,char_const&[],std::__cxx11::string_const&,char&&)
              ::makePair,&local_128);
  local_170 = *(undefined8 *)*args_local;
  local_168 = *(undefined8 *)(*args_local + 8);
  cmAlphaNum::cmAlphaNum(&local_160,*(string_view *)args_local);
  cmStrCat<char_const(&)[21],cm::static_string_view&,char_const(&)[12],std::__cxx11::string_const&,char_const(&)[4],std::__cxx11::string_const&,char>(char_const(&)[21],cm::static_string_view&,char_const(&)[12],std::__cxx11::string_const&,char_const(&)[4],std::__cxx11::string_const&,char&&)
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_d8,
             &cmStrCat<char_const(&)[21],cm::static_string_view&,char_const(&)[12],std::__cxx11::string_const&,char_const(&)[4],std::__cxx11::string_const&,char>(char_const&[],cm::static_string_view&,char_const&[],std::__cxx11::string_const&,char_const&[],std::__cxx11::string_const&,char&&)
              ::makePair,&local_160);
  cmAlphaNum::cmAlphaNum(&local_1a8,(char *)args_local_1);
  cmStrCat<char_const(&)[21],cm::static_string_view&,char_const(&)[12],std::__cxx11::string_const&,char_const(&)[4],std::__cxx11::string_const&,char>(char_const(&)[21],cm::static_string_view&,char_const(&)[12],std::__cxx11::string_const&,char_const(&)[4],std::__cxx11::string_const&,char&&)
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_c0,
             &cmStrCat<char_const(&)[21],cm::static_string_view&,char_const(&)[12],std::__cxx11::string_const&,char_const(&)[4],std::__cxx11::string_const&,char>(char_const&[],cm::static_string_view&,char_const&[],std::__cxx11::string_const&,char_const&[],std::__cxx11::string_const&,char&&)
              ::makePair,&local_1a8);
  cmAlphaNum::cmAlphaNum(&local_1e0,(string *)args_local_2);
  cmStrCat<char_const(&)[21],cm::static_string_view&,char_const(&)[12],std::__cxx11::string_const&,char_const(&)[4],std::__cxx11::string_const&,char>(char_const(&)[21],cm::static_string_view&,char_const(&)[12],std::__cxx11::string_const&,char_const(&)[4],std::__cxx11::string_const&,char&&)
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_a8,
             &cmStrCat<char_const(&)[21],cm::static_string_view&,char_const(&)[12],std::__cxx11::string_const&,char_const(&)[4],std::__cxx11::string_const&,char>(char_const&[],cm::static_string_view&,char_const&[],std::__cxx11::string_const&,char_const&[],std::__cxx11::string_const&,char&&)
              ::makePair,&local_1e0);
  cmAlphaNum::cmAlphaNum(&local_218,*local_38);
  cmStrCat<char_const(&)[21],cm::static_string_view&,char_const(&)[12],std::__cxx11::string_const&,char_const(&)[4],std::__cxx11::string_const&,char>(char_const(&)[21],cm::static_string_view&,char_const(&)[12],std::__cxx11::string_const&,char_const(&)[4],std::__cxx11::string_const&,char&&)
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_90,
             &cmStrCat<char_const(&)[21],cm::static_string_view&,char_const(&)[12],std::__cxx11::string_const&,char_const(&)[4],std::__cxx11::string_const&,char>(char_const&[],cm::static_string_view&,char_const&[],std::__cxx11::string_const&,char_const&[],std::__cxx11::string_const&,char&&)
              ::makePair,&local_218);
  cmAlphaNum::cmAlphaNum(&local_250,args_3);
  cmStrCat<char_const(&)[21],cm::static_string_view&,char_const(&)[12],std::__cxx11::string_const&,char_const(&)[4],std::__cxx11::string_const&,char>(char_const(&)[21],cm::static_string_view&,char_const(&)[12],std::__cxx11::string_const&,char_const(&)[4],std::__cxx11::string_const&,char&&)
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_78,
             &cmStrCat<char_const(&)[21],cm::static_string_view&,char_const(&)[12],std::__cxx11::string_const&,char_const(&)[4],std::__cxx11::string_const&,char>(char_const&[],cm::static_string_view&,char_const&[],std::__cxx11::string_const&,char_const&[],std::__cxx11::string_const&,char&&)
              ::makePair,&local_250);
  cmAlphaNum::cmAlphaNum(&local_288,*args_4);
  cmStrCat<char_const(&)[21],cm::static_string_view&,char_const(&)[12],std::__cxx11::string_const&,char_const(&)[4],std::__cxx11::string_const&,char>(char_const(&)[21],cm::static_string_view&,char_const(&)[12],std::__cxx11::string_const&,char_const(&)[4],std::__cxx11::string_const&,char&&)
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_60,
             &cmStrCat<char_const(&)[21],cm::static_string_view&,char_const(&)[12],std::__cxx11::string_const&,char_const(&)[4],std::__cxx11::string_const&,char>(char_const&[],cm::static_string_view&,char_const&[],std::__cxx11::string_const&,char_const&[],std::__cxx11::string_const&,char&&)
              ::makePair,&local_288);
  local_48 = &local_f0;
  local_40 = 7;
  views._M_len = 7;
  views._M_array = local_48;
  cmCatViews(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(A&& a, B&& b, AV&&... args)
{
  static auto const makePair =
    [](const cmAlphaNum& arg) -> std::pair<cm::string_view, std::string*> {
    return { arg.View(), arg.RValueString() };
  };

  return cmCatViews({ makePair(std::forward<A>(a)),
                      makePair(std::forward<B>(b)),
                      makePair(std::forward<AV>(args))... });
}